

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

Result * __thiscall
httplib::ClientImpl::Get
          (Result *__return_storage_ptr__,ClientImpl *this,string *path,Headers *headers,
          Progress *progress)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rep_type *p_Var3;
  ssize_t sVar4;
  int __flags;
  type res;
  Error error;
  _Head_base<0UL,_httplib::Response_*,_false> local_290;
  _Head_base<0UL,_httplib::Response_*,_false> local_288;
  Error local_27c;
  ClientImpl *local_278;
  Progress *local_270;
  undefined1 local_268 [32];
  _Alloc_hider local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  _Alloc_hider local_1f8;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider local_1d8;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  int local_1b8;
  _Alloc_hider local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Rb_tree_node_base local_168;
  size_t local_148;
  _Rb_tree_node_base local_138;
  undefined1 local_118 [128];
  function<bool_(unsigned_long,_unsigned_long)> local_98;
  size_t local_70;
  size_t local_68;
  _Any_data _Stack_60;
  undefined1 uStack_50;
  undefined7 uStack_4f;
  undefined1 uStack_48;
  undefined8 uStack_47;
  size_t local_38;
  
  local_268._0_8_ = local_268 + 0x10;
  local_268._8_8_ = 0;
  local_268[0x10] = '\0';
  local_248._M_p = (pointer)&local_238;
  local_240 = 0;
  local_238._M_local_buf[0] = '\0';
  p_Var2 = &local_228._M_impl.super__Rb_tree_header;
  local_228._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_228._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_228._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1f8._M_p = (pointer)&local_1e8;
  local_1f0 = 0;
  local_1e8._M_local_buf[0] = '\0';
  local_1d8._M_p = (pointer)&local_1c8;
  local_1d0 = 0;
  local_1c8._M_local_buf[0] = '\0';
  local_1b8 = -1;
  local_1b0._M_p = (pointer)&local_1a0;
  local_1a8 = 0;
  local_1a0._M_local_buf[0] = '\0';
  local_190._M_p = (pointer)&local_180;
  local_188 = 0;
  local_180._M_local_buf[0] = '\0';
  local_168._M_left = &local_168;
  local_168._M_color = _S_red;
  local_168._M_parent = (_Base_ptr)0x0;
  local_148 = 0;
  local_138._M_left = &local_138;
  local_138._M_color = _S_red;
  local_138._M_parent = (_Base_ptr)0x0;
  local_278 = this;
  local_270 = progress;
  local_228._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_228._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  local_168._M_right = local_168._M_left;
  local_138._M_right = local_138._M_left;
  memset(local_118,0,0xa8);
  local_70 = 0x14;
  local_38 = 0;
  local_68 = 0;
  _Stack_60._M_unused._M_object = (void *)0x0;
  _Stack_60._8_8_ = 0;
  uStack_50 = 0;
  uStack_4f = 0;
  uStack_48 = 0;
  uStack_47 = 0;
  __flags = 3;
  std::__cxx11::string::_M_replace((ulong)local_268,0,(char *)0x0,0x175ab4);
  std::__cxx11::string::_M_assign((string *)&local_248);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&local_228,&headers->_M_t);
  std::function<bool_(unsigned_long,_unsigned_long)>::operator=(&local_98,local_270);
  detail::make_unique<httplib::Response>();
  local_27c = Success;
  sVar4 = send(local_278,(int)local_268,local_290._M_head_impl,(size_t)&local_27c,__flags);
  if ((char)sVar4 == '\0') {
    local_288._M_head_impl = (Response *)0x0;
  }
  else {
    local_288._M_head_impl = local_290._M_head_impl;
    local_290._M_head_impl = (Response *)0x0;
  }
  (__return_storage_ptr__->res_)._M_t.
  super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
  super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl = local_288._M_head_impl;
  local_288._M_head_impl = (Response *)0x0;
  __return_storage_ptr__->err_ = local_27c;
  p_Var1 = &(__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header;
  if (local_228._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color
         = _S_red;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)0x0;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
         = &p_Var1->_M_header;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
         = &p_Var1->_M_header;
    p_Var3 = &(__return_storage_ptr__->request_headers_)._M_t;
  }
  else {
    p_Var3 = &local_228;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color
         = local_228._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = local_228._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
         = local_228._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
         = local_228._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_228._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_228._M_impl.super__Rb_tree_header._M_node_count;
    local_228._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_228._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_228._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  (p_Var3->_M_impl).super__Rb_tree_header._M_node_count = 0;
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
            ((unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)&local_288);
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
            ((unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)&local_290);
  Request::~Request((Request *)local_268);
  return __return_storage_ptr__;
}

Assistant:

inline Result ClientImpl::Get(const std::string& path, const Headers& headers,
        Progress progress) {
        Request req;
        req.method = "GET";
        req.path = path;
        req.headers = headers;
        req.progress = std::move(progress);

        return send_(std::move(req));
    }